

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

const_reference __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::at
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos)

{
  logic_error *this_00;
  out_of_range local_20 [16];
  
  if (pos < this->size_) {
    return this->data_ + pos;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(local_20,"nonstd::string_view::at()");
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(code **)this_00 = operator_delete;
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

at( size_type pos ) const
    {
#if nssv_CONFIG_NO_EXCEPTIONS
        assert( pos < size() );
#else
        if ( pos >= size() )
        {
            throw std::out_of_range("nonstd::string_view::at()");
        }
#endif
        return data_at( pos );
    }